

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::WakeUpLocalWorkerThread
          (CPalSynchronizationManager *this,SynchWorkerCmd swcWorkerCmd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_28;
  undefined1 local_21;
  int iRetryCount;
  BYTE byCmd;
  ssize_t sszWritten;
  PAL_ERROR palErr;
  SynchWorkerCmd swcWorkerCmd_local;
  CPalSynchronizationManager *this_local;
  
  sszWritten._0_4_ = 0;
  sszWritten._4_4_ = swcWorkerCmd;
  _palErr = this;
  if ((swcWorkerCmd & 0xff) != swcWorkerCmd) {
    fprintf(_stderr,"] %s %s:%d","WakeUpLocalWorkerThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x9e8);
    fprintf(_stderr,
            "Expression: (swcWorkerCmd & 0xFF) == swcWorkerCmd, Description: Value too big for swcWorkerCmd\n"
           );
  }
  if ((sszWritten._4_4_ != SynchWorkerCmdNop) && (sszWritten._4_4_ != SynchWorkerCmdShutdown)) {
    fprintf(_stderr,"] %s %s:%d","WakeUpLocalWorkerThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x9ed);
    fprintf(_stderr,
            "Expression: (SynchWorkerCmdNop == swcWorkerCmd) || (SynchWorkerCmdShutdown == swcWorkerCmd), Description: WakeUpLocalWorkerThread supports only SynchWorkerCmdNop and SynchWorkerCmdShutdown  [received cmd=%d]\n"
            ,(ulong)sszWritten._4_4_);
  }
  local_21 = (undefined1)sszWritten._4_4_;
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    local_28 = 0;
    do {
      _iRetryCount = write(this->m_iProcessPipeWrite,&local_21,1);
      bVar3 = false;
      if (_iRetryCount == -1) {
        piVar2 = __errno_location();
        bVar3 = false;
        if (*piVar2 == 0xb) {
          local_28 = local_28 + 1;
          bVar3 = false;
          if (local_28 < 0x80) {
            iVar1 = sched_yield();
            bVar3 = iVar1 == 0;
          }
        }
      }
    } while (bVar3);
    if (_iRetryCount != 1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar2 = __errno_location();
      strerror(*piVar2);
      sszWritten._0_4_ = 0x54f;
    }
    return (PAL_ERROR)sszWritten;
  }
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::WakeUpLocalWorkerThread(
        SynchWorkerCmd swcWorkerCmd)
    {
        PAL_ERROR palErr = NO_ERROR;
        ssize_t sszWritten;
        BYTE byCmd;
        int iRetryCount;

        _ASSERT_MSG((swcWorkerCmd & 0xFF) == swcWorkerCmd,
                    "Value too big for swcWorkerCmd\n");
        _ASSERT_MSG((SynchWorkerCmdNop == swcWorkerCmd) ||
                    (SynchWorkerCmdShutdown == swcWorkerCmd),
                    "WakeUpLocalWorkerThread supports only "
                    "SynchWorkerCmdNop and SynchWorkerCmdShutdown  "
                    "[received cmd=%d]\n", swcWorkerCmd);

        byCmd = (BYTE)(swcWorkerCmd & 0xFF);

        TRACE("Waking up Synch Worker Thread for %u [byCmd=%u]\n",
                    swcWorkerCmd, (unsigned int)byCmd);

        // As long as we use pipes and we keep the message size
        // within PIPE_BUF, there's no need to lock here, since the
        // write is guaranteed not to be interleaved with/into other
        // writes of PIPE_BUF bytes or less.
        _ASSERT_MSG(sizeof(BYTE) <= PIPE_BUF, "Message too long\n");

        iRetryCount = 0;
        do
        {
            sszWritten = write(m_iProcessPipeWrite, &byCmd, sizeof(BYTE));
        } while (-1 == sszWritten &&
                 EAGAIN == errno &&
                 ++iRetryCount < MaxConsecutiveEagains &&
                 0 == sched_yield());

        if (sszWritten != sizeof(BYTE))
        {
            ERROR("Unable to write the the process pipe to wakeup the "
                   "worker thread [errno=%d (%s)]\n", errno, strerror(errno));
            palErr = ERROR_INTERNAL_ERROR;
            goto WUWT_exit;
        }

    WUWT_exit:
        return palErr;
    }